

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockBasicTypeCase::BlockBasicTypeCase
          (BlockBasicTypeCase *this,Context *context,char *name,char *description,VarType *type,
          deUint32 layoutFlags,int numInstances)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  BufferBlock *this_00;
  BufferVar local_90;
  BufferBlock *local_40;
  BufferBlock *block;
  VarType *pVStack_30;
  deUint32 layoutFlags_local;
  VarType *type_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  BlockBasicTypeCase *this_local;
  
  block._4_4_ = layoutFlags;
  pVStack_30 = type;
  type_local = (VarType *)description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext((Context *)name_local);
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,renderCtx,description_local,(char *)type_local,
             GLSL_VERSION_310_ES,BUFFERMODE_PER_BLOCK);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockBasicTypeCase_011c27c8;
  this_00 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_40 = this_00;
  bb::BufferVar::BufferVar(&local_90,"var",pVStack_30,0x1800);
  bb::BufferBlock::addMember(this_00,&local_90);
  bb::BufferVar::~BufferVar(&local_90);
  bb::BufferBlock::setFlags(local_40,block._4_4_);
  if (0 < numInstances) {
    bb::BufferBlock::setArraySize(local_40,numInstances);
    bb::BufferBlock::setInstanceName(local_40,"block");
  }
  return;
}

Assistant:

BlockBasicTypeCase (Context& context, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances)
		: SSBOLayoutCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, BUFFERMODE_PER_BLOCK)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", type, ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}
	}